

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubByteTypes.cpp
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
MILBlob::PackSubByteVecForNonByteAligned<MILBlob::UInt3>
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          MILBlob *this,Span<const_unsigned_char,_18446744073709551615UL> span)

{
  long lVar1;
  byte *pbVar2;
  reference puVar3;
  byte *pbVar4;
  range_error *this_00;
  SpanSize<18446744073709551615UL> SVar5;
  byte bVar6;
  ulong uVar7;
  pointer index;
  double dVar8;
  undefined1 auVar9 [16];
  Span<const_unsigned_char,_18446744073709551615UL> span_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string local_110;
  string local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  SVar5.m_size = (size_t)span.m_ptr;
  lVar1 = SVar5.m_size * 3;
  auVar9._8_4_ = (int)((ulong)lVar1 >> 0x20);
  auVar9._0_8_ = lVar1;
  auVar9._12_4_ = 0x45300000;
  span_local.m_ptr = (pointer)this;
  span_local.m_size.m_size = SVar5.m_size;
  dVar8 = ceil(((auVar9._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) * 0.125);
  local_130._M_dataplus._M_p._0_1_ = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (__return_storage_ptr__,
             (long)(dVar8 - 9.223372036854776e+18) & (long)dVar8 >> 0x3f | (long)dVar8,
             (value_type_conflict3 *)&local_130,(allocator_type *)&local_150);
  uVar7 = 0;
  index = (pointer)0x0;
  while( true ) {
    if (SVar5.m_size <= index) {
      return __return_storage_ptr__;
    }
    pbVar2 = Util::Span<const_unsigned_char,_18446744073709551615UL>::operator[]
                       (&span_local,(size_t)index);
    if (7 < *pbVar2) break;
    Util::Span<const_unsigned_char,_18446744073709551615UL>::operator[](&span_local,(size_t)index);
    puVar3 = Util::Span<const_unsigned_char,_18446744073709551615UL>::operator[]
                       (&span_local,(size_t)index);
    bVar6 = (byte)uVar7 & 7;
    pbVar2 = (__return_storage_ptr__->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start + (uVar7 >> 3);
    *pbVar2 = *pbVar2 | *puVar3 << bVar6;
    if (5 < bVar6) {
      pbVar4 = Util::Span<const_unsigned_char,_18446744073709551615UL>::operator[]
                         (&span_local,(size_t)index);
      pbVar2 = (__return_storage_ptr__->
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start + (uVar7 >> 3) + 1;
      *pbVar2 = *pbVar2 | *pbVar4 >> (8 - bVar6 & 0x1f);
    }
    index = index + 1;
    uVar7 = uVar7 + 3;
    SVar5.m_size = span_local.m_size.m_size;
  }
  this_00 = (range_error *)__cxa_allocate_exception(0x10);
  pbVar2 = Util::Span<const_unsigned_char,_18446744073709551615UL>::operator[]
                     (&span_local,(size_t)index);
  std::__cxx11::to_string(&local_d0,(uint)*pbVar2);
  std::operator+(&local_b0,"Value ",&local_d0);
  std::operator+(&local_90,&local_b0," is outside allowed subbyte datatype range [");
  std::__cxx11::to_string(&local_f0,0);
  std::operator+(&local_70,&local_90,&local_f0);
  std::operator+(&local_50,&local_70,", ");
  std::__cxx11::to_string(&local_110,7);
  std::operator+(&local_150,&local_50,&local_110);
  std::operator+(&local_130,&local_150,"].");
  std::range_error::range_error(this_00,(string *)&local_130);
  __cxa_throw(this_00,&std::range_error::typeinfo,std::range_error::~range_error);
}

Assistant:

std::vector<uint8_t> PackSubByteVecForNonByteAligned(Util::Span<const decltype(T::data)> span)
{
    std::vector<uint8_t> ret(MILBlob::SizeInBytes<T>(span.Size()), 0);

    for (uint64_t i = 0; i < span.Size(); i++) {
        MILVerifyIsTrue(span[i] <= T::MAX && span[i] >= T::MIN,
                        std::range_error,
                        "Value " + std::to_string(span[i]) + " is outside allowed subbyte datatype range [" +
                            std::to_string(T::MIN) + ", " + std::to_string(T::MAX) + "].");

        auto indexAndOffset = GetIndexAndOffsetForSubByteValue(i, T::SizeInBits);
        auto idx = indexAndOffset.index;
        auto offset = indexAndOffset.offset;

        ret[idx] |= ((uint8_t)(span[i] << offset));
        if (offset > 8 - T::SizeInBits) {
            // part of the i'th element of span spills over to idx+1
            // uint8_t rshift = T::SizeInBits - (8 - offset);
            uint8_t rshift = 8 - offset;
            ret[idx + 1] |= ((uint8_t)span[i] >> rshift);
        }
    }

    return ret;
}